

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0,false>
               (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                begin,__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      end,anon_class_8_1_898a9ca8 comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  c;
  CliqueVar CVar1;
  CliqueVar CVar2;
  uint uVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  pointer pdVar5;
  CliqueVar *pCVar6;
  T tmp_1;
  CliqueVar *pCVar7;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var8;
  ulong uVar9;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var10;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:220:45)>
  __cmp;
  long lVar11;
  CliqueVar *pCVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  CliqueVar *pCVar16;
  CliqueVar *pCVar17;
  long lVar18;
  _DistanceType __len;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  
  c._M_current = end._M_current + -1;
  do {
    lVar11 = (long)end._M_current - (long)begin._M_current;
    uVar19 = lVar11 >> 2;
    if ((long)uVar19 < 0x18) {
      pCVar7 = begin._M_current + 1;
      if ((leftmost & 1U) == 0) {
        _Var8._M_current = begin._M_current;
        if (pCVar7 == end._M_current || begin._M_current == end._M_current) goto LAB_00268d8f;
        do {
          pCVar16 = pCVar7;
          CVar1 = _Var8._M_current[1];
          pvVar4 = (comp.data)->sol;
          if ((int)CVar1 < 0) {
            dVar22 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff];
          }
          else {
            dVar22 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[(uint)CVar1];
          }
          CVar2 = *_Var8._M_current;
          if ((int)CVar2 < 0) {
            dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(uint)CVar2 & 0x7fffffff];
          }
          else {
            dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[(uint)CVar2];
          }
          uVar13 = (int)CVar1 << 1 | (uint)((int)CVar1 < 0);
          if ((dVar23 < dVar22) ||
             (((int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) < (int)uVar13 && (dVar23 <= dVar22)))
             ) {
            do {
              pCVar7 = _Var8._M_current;
              CVar2 = pCVar7[-1];
              pCVar7[1] = *pCVar7;
              pvVar4 = (comp.data)->sol;
              pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if ((int)CVar1 < 0) {
                dVar22 = pdVar5[(uint)CVar1 & 0x7fffffff];
              }
              else {
                dVar22 = 1.0 - pdVar5[(uint)CVar1];
              }
              if ((int)CVar2 < 0) {
                dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[(uint)CVar2 & 0x7fffffff];
              }
              else {
                dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data._M_start[(uint)CVar2];
              }
              _Var8._M_current = pCVar7 + -1;
            } while ((dVar23 < dVar22) ||
                    (((int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) < (int)uVar13 &&
                     (dVar23 <= dVar22))));
            *pCVar7 = CVar1;
          }
          pCVar7 = pCVar16 + 1;
          _Var8._M_current = pCVar16;
        } while (pCVar7 != end._M_current);
      }
      else {
        if (pCVar7 == end._M_current || begin._M_current == end._M_current) {
LAB_00268d8f:
          bVar21 = true;
          goto LAB_0026975a;
        }
        lVar11 = 0;
        _Var8._M_current = begin._M_current;
        do {
          CVar1 = *pCVar7;
          pvVar4 = (comp.data)->sol;
          if ((int)CVar1 < 0) {
            dVar22 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff];
          }
          else {
            dVar22 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[(uint)CVar1];
          }
          CVar2 = *_Var8._M_current;
          if ((int)CVar2 < 0) {
            dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(uint)CVar2 & 0x7fffffff];
          }
          else {
            dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[(uint)CVar2];
          }
          uVar13 = (int)CVar1 << 1 | (uint)((int)CVar1 < 0);
          if ((dVar23 < dVar22) ||
             (((int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) < (int)uVar13 && (dVar23 <= dVar22)))
             ) {
            pCVar16 = pCVar7 + -1;
            *pCVar7 = CVar2;
            if (pCVar16 != begin._M_current) {
              lVar15 = 0;
              do {
                pvVar4 = (comp.data)->sol;
                pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                if ((int)CVar1 < 0) {
                  dVar22 = pdVar5[(uint)CVar1 & 0x7fffffff];
                }
                else {
                  dVar22 = 1.0 - pdVar5[(uint)CVar1];
                }
                uVar14 = *(uint *)((long)&_Var8._M_current[-1].field_0x0 + lVar15);
                if ((int)uVar14 < 0) {
                  dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar14 & 0x7fffffff];
                }
                else {
                  dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar14];
                }
                if ((dVar22 <= dVar23) &&
                   (((int)uVar13 <= (int)(uVar14 << 1 | (uint)((int)uVar14 < 0)) ||
                    (dVar22 < dVar23)))) break;
                *(uint *)((long)&(_Var8._M_current)->field_0x0 + lVar15) = uVar14;
                lVar15 = lVar15 + -4;
              } while (lVar11 != lVar15);
              pCVar16 = (CliqueVar *)((long)&(_Var8._M_current)->field_0x0 + lVar15);
            }
            *pCVar16 = CVar1;
          }
          pCVar7 = pCVar7 + 1;
          _Var8._M_current = _Var8._M_current + 1;
          lVar11 = lVar11 + -4;
        } while (pCVar7 != end._M_current);
      }
LAB_00268ed5:
      bVar21 = true;
    }
    else {
      uVar20 = uVar19 >> 1;
      _Var8._M_current = begin._M_current + uVar20;
      if ((long)uVar19 < 0x81) {
        sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                  (_Var8,begin,c,comp);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                  (begin,_Var8,c,comp);
        sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                  (begin._M_current + 1,begin._M_current + (uVar20 - 1),end._M_current + -2,comp);
        pCVar7 = begin._M_current + uVar20;
        sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                  (begin._M_current + 2,pCVar7 + 1,end._M_current + -3,comp);
        sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                  (begin._M_current + (uVar20 - 1),_Var8,pCVar7 + 1,comp);
        CVar1 = *begin._M_current;
        *begin._M_current = *pCVar7;
        *pCVar7 = CVar1;
      }
      if ((leftmost & 1U) == 0) {
        CVar1 = begin._M_current[-1];
        pvVar4 = (comp.data)->sol;
        if ((int)CVar1 < 0) {
          dVar22 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff];
        }
        else {
          dVar22 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[(uint)CVar1];
        }
        CVar2 = *begin._M_current;
        if ((int)CVar2 < 0) {
          dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[(uint)CVar2 & 0x7fffffff];
        }
        else {
          dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[(uint)CVar2];
        }
        if ((dVar22 <= dVar23) &&
           ((uVar13 = (int)CVar2 << 1 | (uint)((int)CVar2 < 0),
            (int)((int)CVar1 << 1 | (uint)((int)CVar1 < 0)) <= (int)uVar13 || (dVar22 < dVar23)))) {
          uVar14 = (uint)CVar2 & 0x7fffffff;
          pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = 0;
          while( true ) {
            if ((int)CVar2 < 0) {
              dVar22 = pdVar5[uVar14];
            }
            else {
              dVar22 = 1.0 - pdVar5[(uint)CVar2];
            }
            uVar3 = *(uint *)(&(c._M_current)->field_0x0 + lVar11);
            if ((int)uVar3 < 0) {
              dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar3 & 0x7fffffff];
            }
            else {
              dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start[uVar3];
            }
            if ((dVar22 <= dVar23) &&
               (((int)uVar13 <= (int)(uVar3 << 1 | (uint)((int)uVar3 < 0)) || (dVar22 < dVar23))))
            break;
            lVar11 = lVar11 + -4;
          }
          pCVar7 = (CliqueVar *)(&(c._M_current)->field_0x0 + lVar11);
          if (lVar11 == 0) {
            pCVar16 = begin._M_current + 1;
            while (pCVar12 = pCVar16 + -1, pCVar16 + -1 < pCVar7) {
              pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if ((int)CVar2 < 0) {
                dVar22 = pdVar5[uVar14];
              }
              else {
                dVar22 = 1.0 - pdVar5[(uint)CVar2];
              }
              CVar1 = *pCVar16;
              if ((int)CVar1 < 0) {
                dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff];
              }
              else {
                dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data._M_start[(uint)CVar1];
              }
              pCVar12 = pCVar16;
              if ((dVar23 < dVar22) ||
                 ((pCVar16 = pCVar16 + 1,
                  (int)((int)CVar1 << 1 | (uint)((int)CVar1 < 0)) < (int)uVar13 &&
                  (dVar23 <= dVar22)))) break;
            }
          }
          else {
            pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pCVar16 = begin._M_current + 1;
            do {
              pCVar12 = pCVar16;
              if ((int)CVar2 < 0) {
                dVar22 = pdVar5[uVar14];
              }
              else {
                dVar22 = 1.0 - pdVar5[(uint)CVar2];
              }
              CVar1 = *pCVar12;
              if ((int)CVar1 < 0) {
                dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff];
              }
              else {
                dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data._M_start[(uint)CVar1];
              }
            } while ((dVar22 <= dVar23) &&
                    ((pCVar16 = pCVar12 + 1,
                     (int)uVar13 <= (int)((int)CVar1 << 1 | (uint)((int)CVar1 < 0)) ||
                     (dVar22 < dVar23))));
          }
          while (pCVar12 < pCVar7) {
            CVar1 = *pCVar12;
            *pCVar12 = *pCVar7;
            *pCVar7 = CVar1;
            pvVar4 = (comp.data)->sol;
            pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              pCVar7 = pCVar7 + -1;
              CVar1 = *pCVar7;
              if ((int)CVar2 < 0) {
                dVar22 = pdVar5[uVar14];
              }
              else {
                dVar22 = 1.0 - pdVar5[(uint)CVar2];
              }
              if ((int)CVar1 < 0) {
                dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff];
              }
              else {
                dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data._M_start[(uint)CVar1];
              }
            } while ((dVar23 < dVar22) ||
                    (((int)((int)CVar1 << 1 | (uint)((int)CVar1 < 0)) < (int)uVar13 &&
                     (dVar23 <= dVar22))));
            pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pCVar16 = pCVar12 + 1;
            do {
              pCVar12 = pCVar16;
              CVar1 = *pCVar12;
              if ((int)CVar2 < 0) {
                dVar22 = pdVar5[uVar14];
              }
              else {
                dVar22 = 1.0 - pdVar5[(uint)CVar2];
              }
              if ((int)CVar1 < 0) {
                dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff];
              }
              else {
                dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data._M_start[(uint)CVar1];
              }
            } while ((dVar22 <= dVar23) &&
                    ((pCVar16 = pCVar12 + 1,
                     (int)uVar13 <= (int)((int)CVar1 << 1 | (uint)((int)CVar1 < 0)) ||
                     (dVar22 < dVar23))));
          }
          *begin._M_current = *pCVar7;
          *pCVar7 = CVar2;
          bVar21 = false;
          begin._M_current = pCVar7 + 1;
          goto LAB_0026975a;
        }
      }
      CVar1 = *begin._M_current;
      pvVar4 = (comp.data)->sol;
      uVar13 = (int)CVar1 << 1 | (uint)((int)CVar1 < 0);
      uVar14 = (uint)CVar1 & 0x7fffffff;
      pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar15 = 0;
      _Var8._M_current = begin._M_current;
      while( true ) {
        pCVar7 = _Var8._M_current + 1;
        CVar2 = *pCVar7;
        if ((int)CVar2 < 0) {
          dVar22 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[(uint)CVar2 & 0x7fffffff];
        }
        else {
          dVar22 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[(uint)CVar2];
        }
        if ((int)CVar1 < 0) {
          dVar23 = pdVar5[uVar14];
        }
        else {
          dVar23 = 1.0 - pdVar5[(uint)CVar1];
        }
        if ((dVar22 <= dVar23) &&
           (((int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) <= (int)uVar13 || (dVar22 < dVar23))))
        break;
        lVar15 = lVar15 + -4;
        _Var8._M_current = pCVar7;
      }
      _Var10._M_current = c._M_current;
      if (lVar15 == 0) {
        while (pCVar12 = _Var10._M_current, pCVar16 = pCVar12 + 1, pCVar7 < pCVar12 + 1) {
          CVar2 = *pCVar12;
          if ((int)CVar2 < 0) {
            dVar22 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(uint)CVar2 & 0x7fffffff];
          }
          else {
            dVar22 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[(uint)CVar2];
          }
          pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((int)CVar1 < 0) {
            dVar23 = pdVar5[uVar14];
          }
          else {
            dVar23 = 1.0 - pdVar5[(uint)CVar1];
          }
          pCVar16 = pCVar12;
          if ((dVar23 < dVar22) ||
             ((_Var10._M_current = pCVar12 + -1,
              (int)uVar13 < (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) && (dVar23 <= dVar22))))
          break;
        }
      }
      else {
        pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          pCVar16 = _Var10._M_current;
          CVar2 = *pCVar16;
          if ((int)CVar2 < 0) {
            dVar22 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(uint)CVar2 & 0x7fffffff];
          }
          else {
            dVar22 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[(uint)CVar2];
          }
          if ((int)CVar1 < 0) {
            dVar23 = pdVar5[uVar14];
          }
          else {
            dVar23 = 1.0 - pdVar5[(uint)CVar1];
          }
        } while ((dVar22 <= dVar23) &&
                ((_Var10._M_current = pCVar16 + -1,
                 (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) <= (int)uVar13 || (dVar22 < dVar23)
                 )));
      }
      pCVar12 = pCVar7;
      pCVar17 = pCVar16;
      if (pCVar7 < pCVar16) {
        do {
          CVar2 = *pCVar12;
          *pCVar12 = *pCVar17;
          *pCVar17 = CVar2;
          pvVar4 = (comp.data)->sol;
          pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            _Var8._M_current = pCVar12;
            pCVar12 = _Var8._M_current + 1;
            CVar2 = *pCVar12;
            if ((int)CVar2 < 0) {
              dVar22 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[(uint)CVar2 & 0x7fffffff];
            }
            else {
              dVar22 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start[(uint)CVar2];
            }
            if ((int)CVar1 < 0) {
              dVar23 = pdVar5[uVar14];
            }
            else {
              dVar23 = 1.0 - pdVar5[(uint)CVar1];
            }
          } while ((dVar23 < dVar22) ||
                  (((int)uVar13 < (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) &&
                   (dVar23 <= dVar22))));
          pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pCVar6 = pCVar17 + -1;
          do {
            pCVar17 = pCVar6;
            CVar2 = *pCVar17;
            if ((int)CVar2 < 0) {
              dVar22 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[(uint)CVar2 & 0x7fffffff];
            }
            else {
              dVar22 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start[(uint)CVar2];
            }
            if ((int)CVar1 < 0) {
              dVar23 = pdVar5[uVar14];
            }
            else {
              dVar23 = 1.0 - pdVar5[(uint)CVar1];
            }
          } while ((dVar22 <= dVar23) &&
                  ((pCVar6 = pCVar17 + -1,
                   (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) <= (int)uVar13 ||
                   (dVar22 < dVar23))));
        } while (pCVar12 < pCVar17);
      }
      *begin._M_current = *_Var8._M_current;
      *_Var8._M_current = CVar1;
      uVar9 = (long)_Var8._M_current - (long)begin._M_current >> 2;
      pCVar12 = _Var8._M_current + 1;
      uVar20 = (long)end._M_current - (long)pCVar12 >> 2;
      if (((long)uVar9 < (long)(uVar19 >> 3)) || ((long)uVar20 < (long)(uVar19 >> 3))) {
        bad_allowed = bad_allowed + -1;
        if (bad_allowed == 0) {
          lVar15 = (long)((uVar19 - ((long)(uVar19 - 2) >> 0x3f)) + -2) >> 1;
          do {
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,long,HighsCliqueTable::CliqueVar,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>>
                      (begin,lVar15,uVar19,begin._M_current[lVar15],
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:220:45)>
                        )comp.data);
            bVar21 = lVar15 != 0;
            lVar15 = lVar15 + -1;
          } while (bVar21);
          bVar21 = true;
          _Var8._M_current = c._M_current;
          while (4 < lVar11) {
            CVar1 = *_Var8._M_current;
            *_Var8._M_current = *begin._M_current;
            lVar11 = lVar11 + -4;
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,long,HighsCliqueTable::CliqueVar,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>>
                      (begin,0,lVar11 >> 2,CVar1,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:220:45)>
                        )comp.data);
            _Var8._M_current = _Var8._M_current + -1;
          }
          bad_allowed = 0;
          goto LAB_0026975a;
        }
        if (0x17 < (long)uVar9) {
          uVar19 = uVar9 & 0xfffffffffffffffc;
          CVar1 = *begin._M_current;
          *begin._M_current = *(CliqueVar *)(&(begin._M_current)->field_0x0 + uVar19);
          *(CliqueVar *)(&(begin._M_current)->field_0x0 + uVar19) = CVar1;
          CVar1 = _Var8._M_current[-1];
          _Var8._M_current[-1] = *(_Var8._M_current - uVar19);
          *(_Var8._M_current - uVar19) = CVar1;
          if (0x80 < (long)uVar9) {
            uVar9 = uVar9 >> 2;
            CVar1 = begin._M_current[1];
            begin._M_current[1] = begin._M_current[uVar9 + 1];
            begin._M_current[uVar9 + 1] = CVar1;
            CVar1 = begin._M_current[2];
            begin._M_current[2] = begin._M_current[uVar9 + 2];
            begin._M_current[uVar9 + 2] = CVar1;
            CVar1 = _Var8._M_current[-2];
            _Var8._M_current[-2] = _Var8._M_current[~uVar9];
            _Var8._M_current[~uVar9] = CVar1;
            CVar1 = _Var8._M_current[-3];
            _Var8._M_current[-3] = _Var8._M_current[-2 - uVar9];
            _Var8._M_current[-2 - uVar9] = CVar1;
          }
        }
        if (0x17 < (long)uVar20) {
          CVar1 = _Var8._M_current[1];
          uVar19 = uVar20 & 0xfffffffffffffffc;
          _Var8._M_current[1] = *(CliqueVar *)(&_Var8._M_current[1].field_0x0 + uVar19);
          *(CliqueVar *)(&_Var8._M_current[1].field_0x0 + uVar19) = CVar1;
          CVar1 = end._M_current[-1];
          end._M_current[-1] = *(end._M_current - uVar19);
          *(end._M_current - uVar19) = CVar1;
          if (0x80 < (long)uVar20) {
            uVar20 = uVar20 >> 2;
            CVar1 = _Var8._M_current[2];
            _Var8._M_current[2] = _Var8._M_current[uVar20 + 2];
            _Var8._M_current[uVar20 + 2] = CVar1;
            CVar1 = _Var8._M_current[3];
            _Var8._M_current[3] = _Var8._M_current[uVar20 + 3];
            _Var8._M_current[uVar20 + 3] = CVar1;
            CVar1 = end._M_current[-2];
            end._M_current[-2] = end._M_current[~uVar20];
            end._M_current[~uVar20] = CVar1;
            CVar1 = end._M_current[-3];
            end._M_current[-3] = end._M_current[-2 - uVar20];
            end._M_current[-2 - uVar20] = CVar1;
          }
        }
      }
      else if (pCVar16 <= pCVar7) {
        if (begin._M_current == _Var8._M_current) {
LAB_002695d8:
          if (pCVar12 == end._M_current) goto LAB_00268ed5;
          lVar11 = 4;
          lVar15 = 0;
          uVar19 = 0;
          do {
            pCVar7 = (CliqueVar *)(&_Var8._M_current[1].field_0x0 + lVar11);
            if (pCVar7 == end._M_current) goto LAB_00268ed5;
            CVar1 = *pCVar7;
            pvVar4 = (comp.data)->sol;
            if ((int)CVar1 < 0) {
              dVar22 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff];
            }
            else {
              dVar22 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start[(uint)CVar1];
            }
            pCVar16 = (CliqueVar *)(&(_Var8._M_current)->field_0x0 + lVar11);
            CVar2 = *pCVar16;
            if ((int)CVar2 < 0) {
              dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[(uint)CVar2 & 0x7fffffff];
            }
            else {
              dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start[(uint)CVar2];
            }
            uVar13 = (int)CVar1 << 1 | (uint)((int)CVar1 < 0);
            if ((dVar23 < dVar22) ||
               (((int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) < (int)uVar13 && (dVar23 <= dVar22)
                ))) {
              *pCVar7 = CVar2;
              if (lVar11 != 4) {
                lVar18 = lVar15;
                do {
                  pvVar4 = (comp.data)->sol;
                  pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((int)CVar1 < 0) {
                    dVar22 = pdVar5[(uint)CVar1 & 0x7fffffff];
                  }
                  else {
                    dVar22 = 1.0 - pdVar5[(uint)CVar1];
                  }
                  uVar14 = *(uint *)(&(_Var8._M_current)->field_0x0 + lVar18);
                  if ((int)uVar14 < 0) {
                    dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start[uVar14 & 0x7fffffff];
                  }
                  else {
                    dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_start[uVar14];
                  }
                  if ((dVar22 <= dVar23) &&
                     (((int)uVar13 <= (int)(uVar14 << 1 | (uint)((int)uVar14 < 0)) ||
                      (dVar22 < dVar23)))) break;
                  *(uint *)((long)&pCVar12->field_0x0 + lVar18) = uVar14;
                  lVar18 = lVar18 + -4;
                } while (lVar18 != 0);
                pCVar16 = (CliqueVar *)((long)&pCVar12->field_0x0 + lVar18);
              }
              *pCVar16 = CVar1;
              uVar19 = uVar19 + ((long)pCVar7 - (long)pCVar16 >> 2);
            }
            lVar11 = lVar11 + 4;
            lVar15 = lVar15 + 4;
          } while (uVar19 < 9);
        }
        else {
          lVar11 = 0;
          uVar19 = 0;
          _Var10._M_current = begin._M_current;
          do {
            pCVar7 = _Var10._M_current + 1;
            if (pCVar7 == _Var8._M_current) goto LAB_002695d8;
            CVar1 = _Var10._M_current[1];
            pvVar4 = (comp.data)->sol;
            if ((int)CVar1 < 0) {
              dVar22 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff];
            }
            else {
              dVar22 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start[(uint)CVar1];
            }
            CVar2 = *_Var10._M_current;
            if ((int)CVar2 < 0) {
              dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[(uint)CVar2 & 0x7fffffff];
            }
            else {
              dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start[(uint)CVar2];
            }
            uVar13 = (int)CVar1 << 1 | (uint)((int)CVar1 < 0);
            if ((dVar23 < dVar22) ||
               (((int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0)) < (int)uVar13 && (dVar23 <= dVar22)
                ))) {
              _Var10._M_current[1] = CVar2;
              if (_Var10._M_current != begin._M_current) {
                lVar15 = 0;
                do {
                  pvVar4 = (comp.data)->sol;
                  pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((int)CVar1 < 0) {
                    dVar22 = pdVar5[(uint)CVar1 & 0x7fffffff];
                  }
                  else {
                    dVar22 = 1.0 - pdVar5[(uint)CVar1];
                  }
                  uVar14 = *(uint *)((long)&_Var10._M_current[-1].field_0x0 + lVar15);
                  if ((int)uVar14 < 0) {
                    dVar23 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start[uVar14 & 0x7fffffff];
                  }
                  else {
                    dVar23 = 1.0 - (pvVar4->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_start[uVar14];
                  }
                  if ((dVar22 <= dVar23) &&
                     (((int)uVar13 <= (int)(uVar14 << 1 | (uint)((int)uVar14 < 0)) ||
                      (dVar22 < dVar23)))) break;
                  *(uint *)((long)&(_Var10._M_current)->field_0x0 + lVar15) = uVar14;
                  lVar15 = lVar15 + -4;
                } while (lVar11 != lVar15);
                _Var10._M_current = (CliqueVar *)((long)&(_Var10._M_current)->field_0x0 + lVar15);
              }
              *_Var10._M_current = CVar1;
              uVar19 = uVar19 + ((long)pCVar7 - (long)_Var10._M_current >> 2);
            }
            lVar11 = lVar11 + -4;
            _Var10._M_current = pCVar7;
          } while (uVar19 < 9);
        }
      }
      pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0,false>
                (begin,_Var8,comp,bad_allowed,(bool)(leftmost & 1));
      bVar21 = false;
      leftmost = false;
      begin._M_current = pCVar12;
    }
LAB_0026975a:
    if (bVar21) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }